

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_safe_frame.cpp
# Opt level: O0

bool __thiscall ON_SafeFrame::operator==(ON_SafeFrame *this,ON_SafeFrame *sf)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  double d1;
  double d2;
  double d1_00;
  double d2_00;
  double d1_01;
  double d2_01;
  double d1_02;
  double d2_02;
  ON_SafeFrame *sf_local;
  ON_SafeFrame *this_local;
  
  iVar2 = (*this->_vptr_ON_SafeFrame[5])();
  iVar3 = (*sf->_vptr_ON_SafeFrame[5])();
  if (((byte)iVar2 & 1) == ((byte)iVar3 & 1)) {
    iVar2 = (*this->_vptr_ON_SafeFrame[7])();
    iVar3 = (*sf->_vptr_ON_SafeFrame[7])();
    if (((byte)iVar2 & 1) == ((byte)iVar3 & 1)) {
      iVar2 = (*this->_vptr_ON_SafeFrame[9])();
      iVar3 = (*sf->_vptr_ON_SafeFrame[9])();
      if (((byte)iVar2 & 1) == ((byte)iVar3 & 1)) {
        iVar2 = (*this->_vptr_ON_SafeFrame[0xb])();
        iVar3 = (*sf->_vptr_ON_SafeFrame[0xb])();
        if (((byte)iVar2 & 1) == ((byte)iVar3 & 1)) {
          iVar2 = (*this->_vptr_ON_SafeFrame[0xd])();
          iVar3 = (*sf->_vptr_ON_SafeFrame[0xd])();
          if (((byte)iVar2 & 1) == ((byte)iVar3 & 1)) {
            iVar2 = (*this->_vptr_ON_SafeFrame[0xf])();
            iVar3 = (*sf->_vptr_ON_SafeFrame[0xf])();
            if (((byte)iVar2 & 1) == ((byte)iVar3 & 1)) {
              iVar2 = (*this->_vptr_ON_SafeFrame[0x15])();
              iVar3 = (*sf->_vptr_ON_SafeFrame[0x15])();
              if (((byte)iVar2 & 1) == ((byte)iVar3 & 1)) {
                iVar2 = (*this->_vptr_ON_SafeFrame[0x17])();
                iVar3 = (*sf->_vptr_ON_SafeFrame[0x17])();
                if (((byte)iVar2 & 1) == ((byte)iVar3 & 1)) {
                  (*this->_vptr_ON_SafeFrame[0x11])();
                  (*sf->_vptr_ON_SafeFrame[0x11])();
                  bVar1 = IsDoubleEqual(d1,d2);
                  if (bVar1) {
                    (*this->_vptr_ON_SafeFrame[0x13])();
                    (*sf->_vptr_ON_SafeFrame[0x13])();
                    bVar1 = IsDoubleEqual(d1_00,d2_00);
                    if (bVar1) {
                      (*this->_vptr_ON_SafeFrame[0x19])();
                      (*sf->_vptr_ON_SafeFrame[0x19])();
                      bVar1 = IsDoubleEqual(d1_01,d2_01);
                      if (bVar1) {
                        (*this->_vptr_ON_SafeFrame[0x1b])();
                        (*sf->_vptr_ON_SafeFrame[0x1b])();
                        bVar1 = IsDoubleEqual(d1_02,d2_02);
                        if (bVar1) {
                          this_local._7_1_ = true;
                        }
                        else {
                          this_local._7_1_ = false;
                        }
                      }
                      else {
                        this_local._7_1_ = false;
                      }
                    }
                    else {
                      this_local._7_1_ = false;
                    }
                  }
                  else {
                    this_local._7_1_ = false;
                  }
                }
                else {
                  this_local._7_1_ = false;
                }
              }
              else {
                this_local._7_1_ = false;
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_SafeFrame::operator == (const ON_SafeFrame& sf) const
{
  if (Enabled()           != sf.Enabled())           return false;
  if (PerspectiveOnly()   != sf.PerspectiveOnly())   return false;
  if (FieldGridOn()       != sf.FieldGridOn())       return false;
  if (LiveFrameOn()       != sf.LiveFrameOn())       return false;
  if (ActionFrameOn()     != sf.ActionFrameOn())     return false;
  if (ActionFrameLinked() != sf.ActionFrameLinked()) return false;
  if (TitleFrameOn()      != sf.TitleFrameOn())      return false;
  if (TitleFrameLinked()  != sf.TitleFrameLinked())  return false;

  if (!IsDoubleEqual(ActionFrameXScale(), sf.ActionFrameXScale())) return false;
  if (!IsDoubleEqual(ActionFrameYScale(), sf.ActionFrameYScale())) return false;
  if (!IsDoubleEqual(TitleFrameXScale() , sf.TitleFrameXScale())) return false;
  if (!IsDoubleEqual(TitleFrameYScale() , sf.TitleFrameYScale())) return false;

  return true;
}